

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O0

void __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::processStack(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
               *this,uint newPixelGreyLevel,
              vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
              *regionStack,RegionAllocator<RegionDetector::Region> *regionAllocator)

{
  RegionAllocator<RegionDetector::Region> *this_00;
  uint uVar1;
  bool bVar2;
  reference ppRVar3;
  Region *local_38;
  value_type local_30;
  Region *first;
  RegionAllocator<RegionDetector::Region> *regionAllocator_local;
  vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *regionStack_local;
  RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
  *pRStack_10;
  uint newPixelGreyLevel_local;
  RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
  *this_local;
  
  first = (Region *)regionAllocator;
  regionAllocator_local = (RegionAllocator<RegionDetector::Region> *)regionStack;
  regionStack_local._4_4_ = newPixelGreyLevel;
  pRStack_10 = this;
  ppRVar3 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::back
                      (regionStack);
  local_30 = *ppRVar3;
  std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::pop_back
            ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
             regionAllocator_local);
  do {
    bVar2 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::empty
                      ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                        *)regionAllocator_local);
    uVar1 = regionStack_local._4_4_;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!regionStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                    ,0x35,
                    "void RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::processStack(unsigned int, std::vector<REGION_TYPE *> &, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    ppRVar3 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::back
                        ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                          *)regionAllocator_local);
    this_00 = regionAllocator_local;
    if (uVar1 < (*ppRVar3)->level) {
      local_38 = RegionAllocator<RegionDetector::Region>::new_
                           ((RegionAllocator<RegionDetector::Region> *)first,regionStack_local._4_4_
                           );
      std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::push_back
                ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
                 this_00,&local_38);
      ppRVar3 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::
                back((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
                     regionAllocator_local);
      if (*ppRVar3 != (value_type)0x0) {
        ppRVar3 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::
                  back((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                        *)regionAllocator_local);
        Region::merge(*ppRVar3,local_30);
        return;
      }
      __assert_fail("regionStack.back()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                    ,0x39,
                    "void RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::processStack(unsigned int, std::vector<REGION_TYPE *> &, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    bVar2 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::empty
                      ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                        *)regionAllocator_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!regionStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                    ,0x3f,
                    "void RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::processStack(unsigned int, std::vector<REGION_TYPE *> &, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    ppRVar3 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::back
                        ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                          *)regionAllocator_local);
    Region::merge(*ppRVar3,local_30);
    uVar1 = regionStack_local._4_4_;
    ppRVar3 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::back
                        ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                          *)regionAllocator_local);
  } while ((*ppRVar3)->level < uVar1);
  return;
}

Assistant:

void processStack(unsigned int newPixelGreyLevel, std::vector<REGION_TYPE*> &regionStack, REGION_ALLOCATOR_TYPE *regionAllocator) {

			Region *first = regionStack.back();
			regionStack.pop_back();

			do {
				assert(!regionStack.empty());
				if (newPixelGreyLevel < regionStack.back()->level) {

					regionStack.push_back(regionAllocator->new_(newPixelGreyLevel));
					assert(regionStack.back());
					regionStack.back()->merge(first);

					return;
				}

				assert(!regionStack.empty());
				regionStack.back()->merge(first);

			} while (newPixelGreyLevel > regionStack.back()->level);
		}